

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O0

string * __thiscall
re2c::InputAPI::expr_lessthan_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this,size_t n)

{
  opt_t *poVar1;
  ostream *poVar2;
  ostringstream local_198 [8];
  ostringstream s;
  size_t n_local;
  InputAPI *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  if (this->type_ == DEFAULT) {
    poVar2 = std::operator<<((ostream *)local_198,"(");
    poVar1 = Opt::operator->((Opt *)&opts);
    poVar2 = std::operator<<(poVar2,(string *)&poVar1->yylimit);
    poVar2 = std::operator<<(poVar2," - ");
    poVar1 = Opt::operator->((Opt *)&opts);
    poVar2 = std::operator<<(poVar2,(string *)&poVar1->yycursor);
    poVar2 = std::operator<<(poVar2,") < ");
    std::ostream::operator<<(poVar2,n);
  }
  else if (this->type_ == CUSTOM) {
    poVar1 = Opt::operator->((Opt *)&opts);
    poVar2 = std::operator<<((ostream *)local_198,(string *)&poVar1->yylessthan);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
    std::operator<<(poVar2,")");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::expr_lessthan (size_t n) const
{
	std::ostringstream s;
	switch (type_)
	{
		case DEFAULT:
			s << "(" << opts->yylimit << " - " << opts->yycursor << ") < " << n;
			break;
		case CUSTOM:
			s << opts->yylessthan << " (" << n << ")";
			break;
	}
	return s.str ();
}